

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O3

void __thiscall Application::queryCancelOrder(Application *this)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  string *this_00;
  Message cancel;
  undefined1 local_2c0 [344];
  Message local_168 [344];
  
  iVar3 = queryVersion(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nOrderCancelRequest\n",0x14);
  FIX::Message::Message(local_168);
  switch(iVar3) {
  case 0x28:
    queryOrderCancelRequest40((OrderCancelRequest *)local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)local_2c0);
    break;
  case 0x29:
    queryOrderCancelRequest41((OrderCancelRequest *)local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)local_2c0);
    break;
  case 0x2a:
    queryOrderCancelRequest42((OrderCancelRequest *)local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)local_2c0);
    break;
  case 0x2b:
    queryOrderCancelRequest43((OrderCancelRequest *)local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)local_2c0);
    break;
  case 0x2c:
    queryOrderCancelRequest44((OrderCancelRequest *)local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)local_2c0);
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"No test for version ",0x14);
    plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar3);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    goto LAB_001110a9;
  case 0x32:
    queryOrderCancelRequest50((OrderCancelRequest *)local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)local_2c0);
  }
  FIX::Message::~Message((Message *)local_2c0);
LAB_001110a9:
  pcVar1 = local_2c0 + 0x10;
  this_00 = (string *)local_2c0;
  local_2c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>(this_00,"Send cancel","");
  bVar2 = queryConfirm((Application *)this_00,(string *)local_2c0);
  if ((pointer)local_2c0._0_8_ != pcVar1) {
    operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
  }
  if (bVar2) {
    local_2c0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"");
    FIX::Session::sendToTarget(local_168,(string *)local_2c0);
    if ((pointer)local_2c0._0_8_ != pcVar1) {
      operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
    }
  }
  FIX::Message::~Message(local_168);
  return;
}

Assistant:

void Application::queryCancelOrder() {
  int version = queryVersion();
  std::cout << "\nOrderCancelRequest\n";
  FIX::Message cancel;

  switch (version) {
  case 40:
    cancel = queryOrderCancelRequest40();
    break;
  case 41:
    cancel = queryOrderCancelRequest41();
    break;
  case 42:
    cancel = queryOrderCancelRequest42();
    break;
  case 43:
    cancel = queryOrderCancelRequest43();
    break;
  case 44:
    cancel = queryOrderCancelRequest44();
    break;
  case 50:
    cancel = queryOrderCancelRequest50();
    break;
  default:
    std::cerr << "No test for version " << version << std::endl;
    break;
  }

  if (queryConfirm("Send cancel")) {
    FIX::Session::sendToTarget(cancel);
  }
}